

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O1

long __thiscall
ylt::metric::thread_local_value<long>::update(thread_local_value<long> *this,long value)

{
  atomic<long> aVar1;
  __base_type _Var2;
  atomic<long> *paVar3;
  ulong uVar4;
  pointer paVar5;
  __int_type _Var6;
  
  paVar3 = get_value(this,0);
  LOCK();
  _Var6 = (paVar3->super___atomic_base<long>)._M_i;
  (paVar3->super___atomic_base<long>)._M_i = value;
  UNLOCK();
  paVar5 = (this->duplicates_).
           super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->duplicates_).
                        super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5)) {
    uVar4 = 1;
    do {
      if (paVar5[uVar4]._M_b._M_p != (__pointer_type)0x0) {
        _Var2._M_p = (this->duplicates_).
                     super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_b._M_p;
        LOCK();
        aVar1.super___atomic_base<long>._M_i = (_Var2._M_p)->super___atomic_base<long>;
        (_Var2._M_p)->super___atomic_base<long> = (__atomic_base<long>)0x0;
        UNLOCK();
        _Var6 = _Var6 + (long)aVar1.super___atomic_base<long>._M_i;
      }
      uVar4 = uVar4 + 1;
      paVar5 = (this->duplicates_).
               super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->duplicates_).
                                   super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3));
  }
  return _Var6;
}

Assistant:

value_type update(value_type value = 1) {
    value_type val = get_value(0).exchange(value, std::memory_order::relaxed);
    for (size_t i = 1; i < duplicates_.size(); i++) {
      if (duplicates_[i]) {
        val += duplicates_[i].load()->exchange(0, std::memory_order::relaxed);
      }
    }
    return val;
  }